

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this)

{
  StrictSnapshotMockPtr *snapshot;
  TableauPileMock *this_00;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_01;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Solitaire *this_02;
  char *message;
  InSequence seq;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_b8;
  MatcherBase<unsigned_int> local_98;
  AssertionResult gtest_ar;
  testing local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  PileId local_4c;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  
  testing::InSequence::InSequence(&seq);
  snapshot = &(this->super_SolitaireEmptyHandTest).snapshotMock;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
            (&this->super_SolitaireEmptyHandTest,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock,snapshot);
  this_00 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_98,2);
  piles::TableauPileMock::gmock_tryPullOutCards
            (&local_b8,this_00,(Matcher<unsigned_int> *)&local_98);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x138,"lastTableauPileMock","tryPullOutCards(quantityToPullOut)");
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_30,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (local_60,(vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                      &local_30);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
              *)&gtest_ar,(ReturnAction *)local_60);
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::WillOnce(this_01,(Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                      *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_30);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_b8.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_98);
  SolitaireEmptyHandTest::expectSavingSourcePileSnapshot
            (&this->super_SolitaireEmptyHandTest,snapshot);
  this_02 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  local_4c.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryPullOutCardsFromTableauPile(this_02,&local_4c,2);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
              *)&local_48,(testing *)(anonymous_namespace)::twoCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
              *)&local_b8,(internal *)&local_48,matcher);
  Solitaire::getCardsInHand(this_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&gtest_ar,(char *)&local_b8,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            ((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &local_b8);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x13d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_b8.function_mocker_ !=
        (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
         *)0x0) {
      (*((local_b8.function_mocker_)->super_UntypedFunctionMockerBase).
        _vptr_UntypedFunctionMockerBase[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::InSequence::~InSequence(&seq);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardsFromTableauPile) {
    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(twoCards));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}